

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O3

int main(void)

{
  _Atomic_word *p_Var1;
  int iVar2;
  shared_ptr<vmips::Function> f;
  shared_ptr<vmips::VirtReg> size;
  shared_ptr<vmips::Function> write;
  shared_ptr<vmips::VirtReg> waddr;
  shared_ptr<vmips::VirtReg> addr;
  shared_ptr<vmips::VirtReg> fd;
  shared_ptr<vmips::Function> free;
  shared_ptr<vmips::Function> memcpy;
  shared_ptr<vmips::Function> malloc;
  shared_ptr<vmips::Data> greetings;
  char data [15];
  Module module;
  Function *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  shared_ptr<vmips::VirtReg> local_238;
  element_type *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  ulong local_218;
  shared_ptr<vmips::VirtReg> local_208;
  weak_ptr<vmips::Function> local_1f8;
  weak_ptr<vmips::Function> local_1e8;
  weak_ptr<vmips::Function> local_1d8;
  shared_ptr<vmips::VirtReg> local_1c8;
  shared_ptr<vmips::VirtReg> local_1b8;
  weak_ptr<vmips::Function> local_1a8;
  shared_ptr<vmips::VirtReg> local_198;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  element_type *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  Function local_158 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  undefined7 local_148;
  undefined1 local_141;
  undefined7 uStack_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  Module local_78 [24];
  vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
  local_60 [24];
  vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
  local_48 [24];
  undefined1 *local_30;
  undefined1 local_20 [16];
  
  uStack_140 = 0xa21646c726f;
  local_148 = 0x202c6f6c6c6568;
  local_141 = 0x77;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"test","");
  vmips::Module::Module(local_78,(string *)local_98);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"write","");
  vmips::Module::create_extern(&local_228,local_78,local_b8,3);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"malloc","");
  vmips::Module::create_extern(&local_168,local_78,local_d8,1);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"memcpy","");
  vmips::Module::create_extern(&local_178,local_78,local_f8,3);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"free","");
  vmips::Module::create_extern(&local_188,local_78,local_118,1);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"main","");
  vmips::Module::create_function(&local_248,local_78,local_138,3);
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  vmips::Function::create_data<vmips::asciiz,char(&)[15]>
            (local_158,SUB81(local_248,0),(char (*) [15])0x1);
  local_218 = 0xf;
  vmips::CFGNode::append<vmips::li,unsigned_long>
            ((CFGNode *)&local_238,*(unsigned_long **)(local_248 + 0x148));
  local_218 = local_218 & 0xffffffff00000000;
  vmips::CFGNode::append<vmips::li,int>((CFGNode *)&local_198,*(int **)(local_248 + 0x148));
  vmips::CFGNode::append<vmips::la,std::shared_ptr<vmips::Data>&>
            ((CFGNode *)&local_208,*(shared_ptr<vmips::Data> **)(local_248 + 0x148));
  local_1a8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_228;
  local_1a8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_220;
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_220->_M_weak_count = local_220->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      local_220->_M_weak_count = local_220->_M_weak_count + 1;
    }
  }
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_248,&local_1a8,&local_198,&local_208,&local_238);
  if (local_1a8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_1a8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_1a8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_1a8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_1a8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  local_1c8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_168;
  local_1c8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_160;
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_160->_M_weak_count = local_160->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      local_160->_M_weak_count = local_160->_M_weak_count + 1;
    }
  }
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)&local_1b8,(weak_ptr<vmips::Function> *)local_248,&local_1c8);
  if (local_1c8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_1c8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_1c8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_1c8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_1c8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  local_1d8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_178;
  local_1d8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_170;
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_170->_M_weak_count = local_170->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      local_170->_M_weak_count = local_170->_M_weak_count + 1;
    }
  }
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_248,&local_1d8,&local_1b8,&local_208,&local_238);
  if (local_1d8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_1d8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_1d8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_1d8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_1d8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  local_1e8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_228;
  local_1e8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_220;
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_220->_M_weak_count = local_220->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      local_220->_M_weak_count = local_220->_M_weak_count + 1;
    }
  }
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (local_248,&local_1e8,&local_198,&local_208,&local_238);
  if (local_1e8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_1e8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_1e8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_1e8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_1e8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  local_1f8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_188;
  local_1f8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_180;
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_180->_M_weak_count = local_180->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      local_180->_M_weak_count = local_180->_M_weak_count + 1;
    }
  }
  vmips::Function::call_void<std::shared_ptr<vmips::VirtReg>&>(local_248,&local_1f8,&local_1b8);
  if (local_1f8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_1f8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_1f8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_1f8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_1f8.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  vmips::Function::assign_special((SpecialReg)local_248,2);
  vmips::Module::finalize(local_78);
  vmips::Module::output((ostream *)local_78);
  if (local_1b8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_208.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_198.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_238.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
  }
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
  }
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
  }
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
  }
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  std::vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
  ::~vector(local_48);
  std::vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
  ::~vector(local_60);
  std::vector<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>::~vector
            ((vector<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_> *
             )local_78);
  return 0;
}

Assistant:

int main() {
    char data[] = "hello, world!\n";
    auto module = Module("test");
    auto write = module.create_extern("write", 3);
    auto malloc = module.create_extern("malloc", 1);
    auto memcpy = module.create_extern("memcpy", 3);
    auto free = module.create_extern("free", 1);
    auto f = module.create_function("main", 3);
    auto greetings = f->create_data<asciiz>(true, data );
    auto size = f->append<li>(sizeof(data));
    auto fd = f->append<li>(0);
    auto waddr = f->append<la>(greetings);
    f->call_void(write, fd, waddr, size);
    auto addr = f->call(malloc, size);
    f->call_void(memcpy, addr, waddr, size);
    f->call_void(write, fd, waddr, size);
    f->call_void(free, addr);
    f->assign_special(SpecialReg::v0, 0);
    module.finalize();
    module.output(std::cout);
}